

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  cmState *pcVar1;
  pointer pcVar2;
  cmGlobalGenerator *globalGenerator;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  string *psVar7;
  cmValue value;
  pointer *__ptr;
  uint uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  cmState *pcVar10;
  bool bVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string out_oldest;
  string dep_newest;
  int result_2;
  cmList outputs;
  int result_1;
  cmList depends;
  cmList products;
  ostringstream msg_1;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  undefined1 local_2c28 [32];
  undefined1 local_2c08 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2bf0;
  int local_2bcc;
  cmList local_2bc8;
  undefined1 local_2ba8 [32];
  cmList local_2b88;
  cmList local_2b70;
  undefined1 local_2b58 [16];
  undefined1 local_2b48 [32];
  _Alloc_hider local_2b28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2b20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b18 [3];
  ios_base local_2ae8 [3408];
  undefined1 local_1d98 [112];
  ios_base local_1d28 [3416];
  cmake local_fd0;
  cmGlobalGenerator local_728;
  
  bVar4 = cmsys::SystemTools::HasEnv("VERBOSE");
  if (bVar4) {
    bVar4 = cmsys::SystemTools::HasEnv("CMAKE_NO_VERBOSE");
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      if (bVar4) {
        return 1;
      }
      local_1d98._0_8_ = local_1d98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d98,"Re-run cmake no build system arguments\n","");
      cmSystemTools::Stdout((string *)local_1d98);
      if ((undefined1 *)local_1d98._0_8_ == local_1d98 + 0x10) {
        return 1;
      }
      operator_delete((void *)local_1d98._0_8_,local_1d98._16_8_ + 1);
      return 1;
    }
    bVar5 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
    if (!bVar5) {
      if (bVar4) {
        return 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d98,"Re-run cmake missing file: ",0x1b);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d98,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      local_2b58[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2b58,1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)local_2b58);
      if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
        operator_delete((void *)local_2b58._0_8_,local_2b48._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d98);
      std::ios_base::~ios_base(local_1d28);
      return 1;
    }
    bVar4 = !bVar4;
  }
  else {
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      return 1;
    }
    bVar4 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
    if (!bVar4) {
      return 1;
    }
    bVar4 = false;
  }
  cmake(&local_fd0,RoleScript,Unknown,Normal);
  pcVar2 = local_1d98 + 0x10;
  local_1d98._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d98,"");
  SetHomeDirectory(&local_fd0,(string *)local_1d98);
  if ((pointer)local_1d98._0_8_ != pcVar2) {
    operator_delete((void *)local_1d98._0_8_,local_1d98._16_8_ + 1);
  }
  local_1d98._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d98,"");
  SetHomeOutputDirectory(&local_fd0,(string *)local_1d98);
  if ((pointer)local_1d98._0_8_ != pcVar2) {
    operator_delete((void *)local_1d98._0_8_,local_1d98._16_8_ + 1);
  }
  local_1d98._16_8_ = local_fd0.CurrentSnapshot.Position.Position;
  local_1d98._0_8_ = local_fd0.CurrentSnapshot.State;
  local_1d98._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1d98);
  cmGlobalGenerator::cmGlobalGenerator(&local_728,&local_fd0);
  local_2b48._0_8_ = local_fd0.CurrentSnapshot.Position.Position;
  local_2b58._0_8_ = local_fd0.CurrentSnapshot.State;
  local_2b58._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1d98,&local_728,(cmStateSnapshot *)local_2b58);
  bVar5 = cmMakefile::ReadListFile((cmMakefile *)local_1d98,&this->CheckBuildSystemArgument);
  if ((((!bVar5) || (cmSystemTools::s_ErrorOccurred != false)) ||
      (cmSystemTools::s_FatalErrorOccurred != false)) ||
     (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) {
    uVar8 = 1;
    if (bVar4 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b58,"Re-run cmake error reading : ",0x1d);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_2b58,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      local_2c08[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c08,1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)local_2c08);
      if ((cmState *)local_2c08._0_8_ != (cmState *)(local_2c08 + 0x10)) {
        operator_delete((void *)local_2c08._0_8_,(ulong)(local_2c08._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b58);
      std::ios_base::~ios_base(local_2ae8);
    }
    goto LAB_0030be00;
  }
  if (this->ClearBuildSystem == true) {
    local_2b58._0_8_ = (cmState *)local_2b48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b58,"CMAKE_DEPENDS_GENERATOR","");
    psVar7 = cmMakefile::GetSafeDefinition((cmMakefile *)local_1d98,(string *)local_2b58);
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    local_2c08._0_8_ = local_2c08 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c08,pcVar2,pcVar2 + psVar7->_M_string_length);
    if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
      operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._0_8_ + 1));
    }
    if (local_2c08._8_8_ == 0) {
      std::__cxx11::string::operator=((string *)local_2c08,"Unix Makefiles");
    }
    CreateGlobalGenerator((cmake *)local_2ba8,(string *)this,SUB81(local_2c08,0));
    globalGenerator = (cmGlobalGenerator *)CONCAT44(local_2ba8._4_4_,local_2ba8._0_4_);
    if (globalGenerator != (cmGlobalGenerator *)0x0) {
      local_2b48._0_8_ = local_fd0.CurrentSnapshot.Position.Position;
      local_2b58._0_8_ = local_fd0.CurrentSnapshot.State;
      local_2b58._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_2b58);
      local_2c28._16_8_ = local_fd0.CurrentSnapshot.Position.Position;
      local_2c28._0_8_ = local_fd0.CurrentSnapshot.State;
      local_2c28._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
      cmMakefile::cmMakefile((cmMakefile *)local_2b58,globalGenerator,(cmStateSnapshot *)local_2c28)
      ;
      (*globalGenerator->_vptr_cmGlobalGenerator[2])(local_2c28,globalGenerator,local_2b58);
      (**(code **)(*(long *)local_2c28._0_8_ + 0x60))(local_2c28._0_8_,local_2b58,bVar4);
      if ((cmState *)local_2c28._0_8_ != (cmState *)0x0) {
        (**(code **)(*(long *)local_2c28._0_8_ + 8))();
      }
      cmMakefile::~cmMakefile((cmMakefile *)local_2b58);
      (*globalGenerator->_vptr_cmGlobalGenerator[1])(globalGenerator);
    }
    if ((undefined1 *)local_2c08._0_8_ != local_2c08 + 0x10) {
      operator_delete((void *)local_2c08._0_8_,(ulong)(local_2c08._16_8_ + 1));
    }
  }
  pcVar1 = (cmState *)(local_2c08 + 0x10);
  local_2c08._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c08,"CMAKE_MAKEFILE_PRODUCTS","")
  ;
  psVar7 = (string *)cmMakefile::GetDefinition((cmMakefile *)local_1d98,(string *)local_2c08);
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar2 = (psVar7->_M_dataplus)._M_p;
  local_2b58._0_8_ = (cmState *)local_2b48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b58,pcVar2,pcVar2 + psVar7->_M_string_length);
  init._M_len = 1;
  init._M_array = (iterator)local_2b58;
  cmList::cmList(&local_2b70,init);
  if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
    operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._0_8_ + 1));
  }
  if ((cmState *)local_2c08._0_8_ != pcVar1) {
    operator_delete((void *)local_2c08._0_8_,(ulong)(local_2c08._16_8_ + 1));
  }
  for (; local_2b70.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_2b70.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_2b70.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((_Base_ptr)
                     local_2b70.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1)) {
    bVar5 = cmsys::SystemTools::PathExists
                      (local_2b70.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (!bVar5) {
      uVar8 = 1;
      if (bVar4 != false) {
        local_2b58._0_8_ = (cmState *)0x21;
        local_2b58._8_8_ = "Re-run cmake, missing byproduct: ";
        local_2b48._0_8_ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        local_2b48._16_8_ =
             ((_Alloc_hider *)
             &((_Base_ptr)
              local_2b70.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_color)->_M_p;
        local_2b48._8_8_ =
             ((_Base_ptr)
             local_2b70.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_parent;
        local_2b48._24_8_ = (_Base_ptr)0x0;
        local_2c08._16_8_ = &local_2bf0;
        local_2c08._0_8_ = (cmState *)0x0;
        local_2c08._8_8_ = 1;
        local_2bf0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\n';
        local_2b28._M_p = (pointer)0x1;
        local_2b18[0]._M_allocated_capacity = (pointer)0x0;
        views._M_len = 3;
        views._M_array = (iterator)local_2b58;
        local_2b20 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2c08._16_8_;
        cmCatViews((string *)local_2c28,views);
        cmSystemTools::Stdout((string *)local_2c28);
        if ((cmState *)local_2c28._0_8_ != (cmState *)(local_2c28 + 0x10)) {
          operator_delete((void *)local_2c28._0_8_,(ulong)(local_2c28._16_8_ + 1));
        }
      }
      goto LAB_0030c71f;
    }
  }
  local_2c08._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c08,"CMAKE_MAKEFILE_DEPENDS","");
  psVar7 = (string *)cmMakefile::GetDefinition((cmMakefile *)local_1d98,(string *)local_2c08);
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar2 = (psVar7->_M_dataplus)._M_p;
  local_2b58._0_8_ = (cmState *)local_2b48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b58,pcVar2,pcVar2 + psVar7->_M_string_length);
  init_00._M_len = 1;
  init_00._M_array = (iterator)local_2b58;
  cmList::cmList(&local_2b88,init_00);
  if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
    operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._0_8_ + 1));
  }
  if ((cmState *)local_2c08._0_8_ != pcVar1) {
    operator_delete((void *)local_2c08._0_8_,(ulong)(local_2c08._16_8_ + 1));
  }
  local_2bc8.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2bc8.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2bc8.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2b88.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_2b88.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0030c528:
    uVar8 = 1;
    if (bVar4 != false) {
      local_2b58._0_8_ = (cmState *)local_2b48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b58,
                 "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n","");
      cmSystemTools::Stdout((string *)local_2b58);
      pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b48._0_8_;
      pcVar10 = (cmState *)local_2b58._0_8_;
      if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) goto LAB_0030c700;
    }
  }
  else {
    local_2b58._0_8_ = (cmState *)local_2b48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b58,"CMAKE_MAKEFILE_OUTPUTS","");
    value = cmMakefile::GetDefinition((cmMakefile *)local_1d98,(string *)local_2b58);
    cmList::assign(&local_2bc8,value,Yes,No);
    if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
      operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._0_8_ + 1));
    }
    if ((local_2b88.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_2b88.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (local_2bc8.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_2bc8.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0030c528;
    pcVar2 = ((local_2b88.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_2c08._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c08,pcVar2,
               pcVar2 + (local_2b88.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    psVar7 = local_2b88.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar7 != local_2b88.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_2c28._0_8_ = local_2c28._0_8_ & 0xffffffff00000000;
        bVar5 = cmFileTimeCache::Compare
                          ((this->FileTimeCache)._M_t.
                           super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                           .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,
                           (string *)local_2c08,psVar7,(int *)local_2c28);
        if (!bVar5) {
          if (bVar4 != false) {
            local_2b58._0_8_ = (cmState *)local_2b48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b58,"Re-run cmake: build system dependency is missing\n","")
            ;
            cmSystemTools::Stdout((string *)local_2b58);
            if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
              operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._0_8_ + 1));
            }
          }
          uVar8 = 1;
          goto LAB_0030c6f1;
        }
        if ((int)local_2c28._0_4_ < 0) {
          std::__cxx11::string::_M_assign((string *)local_2c08);
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != local_2b88.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar3 = local_2bc8.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2c28._0_8_ = local_2c28 + 0x10;
    pcVar2 = ((local_2bc8.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c28,pcVar2,
               pcVar2 + (local_2bc8.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    psVar7 = pbVar3 + 1;
    if (psVar7 != local_2bc8.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_2ba8._0_4_ = 0;
        bVar5 = cmFileTimeCache::Compare
                          ((this->FileTimeCache)._M_t.
                           super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                           .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,
                           (string *)local_2c28,psVar7,(int *)local_2ba8);
        if (!bVar5) {
          if (bVar4 != false) {
            local_2b58._0_8_ = (cmState *)local_2b48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b58,"Re-run cmake: build system output is missing\n","");
            cmSystemTools::Stdout((string *)local_2b58);
            if ((cmState *)local_2b58._0_8_ != (cmState *)local_2b48) {
              operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._0_8_ + 1));
            }
          }
          uVar8 = 1;
          goto LAB_0030c6d6;
        }
        if (0 < (int)local_2ba8._0_4_) {
          std::__cxx11::string::_M_assign((string *)local_2c28);
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != local_2bc8.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_2bcc = 0;
    bVar5 = cmFileTimeCache::Compare
                      ((this->FileTimeCache)._M_t.
                       super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                       .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,
                       (string *)local_2c28,(string *)local_2c08,&local_2bcc);
    bVar11 = local_2bcc < 0;
    if (bVar4 == true && (!bVar5 || bVar11)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b58,"Re-run cmake file: ",0x13);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_2b58,(char *)local_2c28._0_8_,local_2c28._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," older than: ",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_2c08._0_8_,local_2c08._8_8_);
      local_2ba8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2ba8,1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)local_2ba8);
      if ((undefined1 *)CONCAT44(local_2ba8._4_4_,local_2ba8._0_4_) != local_2ba8 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_2ba8._4_4_,local_2ba8._0_4_),
                        (ulong)(local_2ba8._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b58);
      std::ios_base::~ios_base(local_2ae8);
    }
    uVar8 = (uint)(!bVar5 || bVar11);
LAB_0030c6d6:
    if ((cmState *)local_2c28._0_8_ != (cmState *)(local_2c28 + 0x10)) {
      operator_delete((void *)local_2c28._0_8_,(ulong)(local_2c28._16_8_ + 1));
    }
LAB_0030c6f1:
    pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c08._16_8_;
    pcVar10 = (cmState *)local_2c08._0_8_;
    if ((cmState *)local_2c08._0_8_ != pcVar1) {
LAB_0030c700:
      operator_delete(pcVar10,(ulong)((long)&(pvVar9->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2bc8.Values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b88.Values);
LAB_0030c71f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b70.Values);
LAB_0030be00:
  cmMakefile::~cmMakefile((cmMakefile *)local_1d98);
  cmGlobalGenerator::~cmGlobalGenerator(&local_728);
  ~cmake(&local_fd0);
  return uVar8;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no build system arguments\n");
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    std::string genName = mf.GetSafeDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!cmNonempty(genName)) {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd =
      this->CreateGlobalGenerator(genName);
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      auto lgd = ggd->CreateLocalGenerator(&mfd);
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  cmList products{ mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS") };
  for (auto const& p : products) {
    if (!cmSystemTools::PathExists(p)) {
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Re-run cmake, missing byproduct: ", p, '\n'));
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  cmList depends{ mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS") };
  cmList outputs;
  if (!depends.empty()) {
    outputs.assign(mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS"));
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
                            "or CMAKE_MAKEFILE_OUTPUTS :\n");
    }
    return 1;
  }

  // Find the newest dependency.
  auto dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system dependency is missing\n");
      }
      return 1;
    }
  }

  // Find the oldest output.
  auto out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system output is missing\n");
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << '\n';
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}